

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VirtualProtect(LPVOID lpAddress,SIZE_T dwSize,DWORD flNewProtect,PDWORD lpflOldProtect)

{
  BYTE *pBVar1;
  byte bVar2;
  BOOL BVar3;
  INT __prot;
  int iVar4;
  DWORD DVar5;
  CPalThread *pThread;
  void *__addr;
  ulong uVar6;
  PCMI pInformation;
  int *piVar7;
  CPalThread *local_70;
  CPalThread *pthrCurrent;
  SIZE_T OffSet;
  SIZE_T NumberOfPagesToChange;
  SIZE_T Index;
  UINT_PTR StartBoundary;
  SIZE_T MemSize;
  PCMI pEntry;
  BOOL bRetVal;
  PDWORD lpflOldProtect_local;
  DWORD flNewProtect_local;
  SIZE_T dwSize_local;
  LPVOID lpAddress_local;
  
  pEntry._4_4_ = 0;
  OffSet = 0;
  pthrCurrent = (CPalThread *)0x0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  __addr = (void *)((ulong)lpAddress & 0xfffffffffffff000);
  uVar6 = dwSize + ((ulong)lpAddress & 0xfff) + 0xfff;
  BVar3 = VIRTUALContainsInvalidProtectionFlags(flNewProtect);
  if (BVar3 == 0) {
    if (lpflOldProtect == (PDWORD)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0x3e6);
    }
    else {
      pInformation = VIRTUALFindRegionInformation((UINT_PTR)__addr);
      if (pInformation != (PCMI)0x0) {
        if (__addr == (void *)pInformation->startBoundary) {
          local_70 = (CPalThread *)0x0;
        }
        else {
          local_70 = (CPalThread *)((long)__addr - pInformation->startBoundary >> 0xc);
        }
        pthrCurrent = local_70;
        NumberOfPagesToChange = (SIZE_T)local_70;
        OffSet = uVar6 >> 0xc;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        for (; NumberOfPagesToChange < OffSet; NumberOfPagesToChange = NumberOfPagesToChange + 1) {
          BVar3 = VIRTUALIsPageCommitted(NumberOfPagesToChange,pInformation);
          if (BVar3 == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            SetLastError(0x1e7);
            goto LAB_00241810;
          }
        }
      }
      __prot = W32toUnixAccessControl(flNewProtect);
      iVar4 = mprotect(__addr,uVar6 & 0xfffffffffffff000,__prot);
      if (iVar4 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        if (pInformation == (PCMI)0x0) {
          *lpflOldProtect = 0x40;
        }
        else {
          DVar5 = VIRTUALConvertVirtualFlags(pInformation->pProtectionState[(long)pthrCurrent]);
          *lpflOldProtect = DVar5;
          pBVar1 = pInformation->pProtectionState;
          bVar2 = VIRTUALConvertWinFlags(flNewProtect);
          memset(pBVar1 + (long)pthrCurrent,(uint)bVar2,OffSet);
        }
        pEntry._4_4_ = 1;
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        piVar7 = __errno_location();
        strerror(*piVar7);
        piVar7 = __errno_location();
        if (*piVar7 == 0x16) {
          SetLastError(0x1e7);
        }
        else {
          piVar7 = __errno_location();
          if (*piVar7 == 0xd) {
            SetLastError(0xc);
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","VirtualProtect",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x8db);
    fprintf(_stderr,
            "flProtect can be one of PAGE_NOACCESS, PAGE_READONLY, PAGE_READWRITE, PAGE_EXECUTE, PAGE_EXECUTE_READ , or PAGE_EXECUTE_READWRITE. \n"
           );
    SetLastError(0x57);
  }
LAB_00241810:
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pEntry._4_4_;
  }
  abort();
}

Assistant:

BOOL
PALAPI
VirtualProtect(
           IN LPVOID lpAddress,
           IN SIZE_T dwSize,
           IN DWORD flNewProtect,
           OUT PDWORD lpflOldProtect)
{
    BOOL     bRetVal = FALSE;
    PCMI     pEntry = NULL;
    SIZE_T   MemSize = 0;
    UINT_PTR StartBoundary = 0;
    SIZE_T   Index = 0;
    SIZE_T   NumberOfPagesToChange = 0;
    SIZE_T   OffSet = 0;
    CPalThread * pthrCurrent;

    PERF_ENTRY(VirtualProtect);
    ENTRY("VirtualProtect(lpAddress=%p, dwSize=%u, flNewProtect=%#x, "
          "flOldProtect=%p)\n",
          lpAddress, dwSize, flNewProtect, lpflOldProtect);

    pthrCurrent = InternalGetCurrentThread();
    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;
    MemSize = (((UINT_PTR)(dwSize) + ((UINT_PTR)(lpAddress) & VIRTUAL_PAGE_MASK)
                + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK);

#if DEBUG
    if ( VIRTUALContainsInvalidProtectionFlags( flNewProtect ) )
    {
        ASSERT( "flProtect can be one of PAGE_NOACCESS, PAGE_READONLY, "
               "PAGE_READWRITE, PAGE_EXECUTE, PAGE_EXECUTE_READ "
               ", or PAGE_EXECUTE_READWRITE. \n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto ExitVirtualProtect;
    }

    if ( !lpflOldProtect)
    {
        ERROR( "lpflOldProtect was invalid.\n" );
        SetLastError( ERROR_NOACCESS );
        goto ExitVirtualProtect;
    }
#endif

    pEntry = VIRTUALFindRegionInformation( StartBoundary );
    if ( NULL != pEntry )
    {
        /* See if the pages are committed. */
        Index = OffSet = StartBoundary - pEntry->startBoundary == 0 ?
             0 : ( StartBoundary - pEntry->startBoundary ) / VIRTUAL_PAGE_SIZE;
        NumberOfPagesToChange = MemSize / VIRTUAL_PAGE_SIZE;

        TRACE( "Number of pages to check %d, starting page %d \n",
               NumberOfPagesToChange, Index );

        for ( ; Index < NumberOfPagesToChange; Index++  )
        {
            if ( !VIRTUALIsPageCommitted( Index, pEntry ) )
            {
                ERROR( "You can only change the protection attributes"
                       " on committed memory.\n" );
                SetLastError( ERROR_INVALID_ADDRESS );
                goto ExitVirtualProtect;
            }
        }
    }

    if ( 0 == mprotect( (LPVOID)StartBoundary, MemSize,
                   W32toUnixAccessControl( flNewProtect ) ) )
    {
        /* Reset the access protection. */
        TRACE( "Number of pages to change %d, starting page %d \n",
               NumberOfPagesToChange, OffSet );
        /*
         * Set the old protection flags. We only use the first flag, so
         * if there were several regions with each with different flags only the
         * first region's protection flag will be returned.
         */
        if ( pEntry )
        {
            *lpflOldProtect =
                VIRTUALConvertVirtualFlags( pEntry->pProtectionState[ OffSet ] );

            memset( pEntry->pProtectionState + OffSet,
                    VIRTUALConvertWinFlags( flNewProtect ),
                    NumberOfPagesToChange );
        }
        else
        {
            *lpflOldProtect = PAGE_EXECUTE_READWRITE;
        }
        bRetVal = TRUE;
    }
    else
    {
        ERROR( "%s\n", strerror( errno ) );
        if ( errno == EINVAL )
        {
            SetLastError( ERROR_INVALID_ADDRESS );
        }
        else if ( errno == EACCES )
        {
            SetLastError( ERROR_INVALID_ACCESS );
        }
    }
ExitVirtualProtect:
    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

    LOGEXIT( "VirtualProtect returning %s.\n", bRetVal == TRUE ? "TRUE" : "FALSE" );
    PERF_EXIT(VirtualProtect);
    return bRetVal;
}